

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

bool __thiscall
trieste::detail::InsideStar<2UL>::match(InsideStar<2UL> *this,NodeIt *it,Node *parent,Match *match)

{
  bool bVar1;
  int iVar2;
  const_iterator pvVar3;
  Token *this_00;
  element_type *peVar4;
  value_type *type;
  const_iterator __end0;
  const_iterator __begin0;
  array<trieste::Token,_2UL> *__range4;
  NodeDef *p;
  Match *match_local;
  Node *parent_local;
  NodeIt *it_local;
  InsideStar<2UL> *this_local;
  bool local_9;
  
  __range4 = (array<trieste::Token,_2UL> *)
             CLI::std::
             __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)parent);
  do {
    if (__range4 == (array<trieste::Token,_2UL> *)0x0) {
      return false;
    }
    __end0 = std::array<trieste::Token,_2UL>::begin(&this->types);
    pvVar3 = std::array<trieste::Token,_2UL>::end(&this->types);
    for (; __end0 != pvVar3; __end0 = __end0 + 1) {
      this_00 = NodeDef::type((NodeDef *)__range4);
      bVar1 = Token::operator==(this_00,__end0);
      if (bVar1) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)&(this->super_PatternDef).continuation);
        if (bVar1) {
          peVar4 = CLI::std::
                   __shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&(this->super_PatternDef).continuation);
          iVar2 = (*peVar4->_vptr_PatternDef[4])(peVar4,it,parent,match);
          local_9 = (bool)((byte)iVar2 & 1);
        }
        else {
          local_9 = true;
        }
        return local_9;
      }
    }
    __range4 = (array<trieste::Token,_2UL> *)NodeDef::parent((NodeDef *)__range4);
  } while( true );
}

Assistant:

bool match(NodeIt& it, const Node& parent, Match& match) const& override
      {
        NodeDef* p = &*parent;

        while (p)
        {
          for (const auto& type : types)
            if (p->type() == type)
              return match_continuation(it, parent, match);

          p = p->parent();
        }

        return false;
      }